

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yin_print_when(lyout *out,int level,lys_module *module,lys_when *when)

{
  char *pcVar1;
  int iVar2;
  
  pcVar1 = transform_json2schema(module,when->cond);
  if (pcVar1 == (char *)0x0) {
    ly_print(out,"(!error!)");
    return;
  }
  ly_print(out,"%*s<when condition=\"",(ulong)(uint)(level * 2));
  lyxml_dump_text(out,pcVar1);
  ly_print(out,"\"");
  lydict_remove(module->ctx,pcVar1);
  iVar2 = level + 1;
  if (when->ext_size == '\0') {
    if (when->dsc != (char *)0x0) {
      ly_print(out,">\n");
      pcVar1 = when->dsc;
      goto LAB_0017ed16;
    }
    if (when->ref == (char *)0x0) {
      iVar2 = 0;
      goto LAB_0017ed6b;
    }
    ly_print(out,">\n");
    pcVar1 = when->ref;
LAB_0017ed42:
    yin_print_substmt(out,iVar2,LYEXT_SUBSTMT_REFERENCE,'\0',pcVar1,module,when->ext,
                      (uint)when->ext_size);
  }
  else {
    ly_print(out,">\n");
    yin_print_extension_instances
              (out,iVar2,module,LYEXT_SUBSTMT_SELF,'\0',when->ext,(uint)when->ext_size);
    pcVar1 = when->dsc;
    if (pcVar1 != (char *)0x0) {
LAB_0017ed16:
      yin_print_substmt(out,iVar2,LYEXT_SUBSTMT_DESCRIPTION,'\0',pcVar1,module,when->ext,
                        (uint)when->ext_size);
    }
    pcVar1 = when->ref;
    if (pcVar1 != (char *)0x0) goto LAB_0017ed42;
  }
  iVar2 = 1;
LAB_0017ed6b:
  yin_print_close(out,level,(char *)0x0,"when",iVar2);
  return;
}

Assistant:

static void
yin_print_when(struct lyout *out, int level, const struct lys_module *module, const struct lys_when *when)
{
    int flag = 0;
    const char *str;

    str = transform_json2schema(module, when->cond);
    if (!str) {
        ly_print(out, "(!error!)");
        return;
    }

    ly_print(out, "%*s<when condition=\"", LEVEL, INDENT);
    lyxml_dump_text(out, str);
    ly_print(out, "\"");
    lydict_remove(module->ctx, str);

    level++;

    if (when->ext_size) {
        /* extension is stored in lys_when incompatible with lys_node, so we cannot use yang_print_snode_common() */
        yin_print_close_parent(out, &flag);
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, when->ext, when->ext_size);
    }
    if (when->dsc != NULL) {
        yin_print_close_parent(out, &flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, when->dsc,
                          module, when->ext, when->ext_size);
    }
    if (when->ref != NULL) {
        yin_print_close_parent(out, &flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, when->ref,
                          module, when->ext, when->ext_size);
    }

    level--;
    yin_print_close(out, level, NULL, "when", flag);
}